

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationFactory.cpp
# Opt level: O3

OptimizationMethod * __thiscall
OpenMD::OptimizationFactory::createOptimization
          (OptimizationFactory *this,string *id,SimInfo *param_2)

{
  iterator iVar1;
  OptimizationMethod *pOVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>_>
                  *)this,id);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->creatorMap_)._M_t._M_impl.super__Rb_tree_header) {
    pOVar2 = (OptimizationMethod *)(**(code **)(**(long **)(iVar1._M_node + 2) + 0x10))();
    return pOVar2;
  }
  return (OptimizationMethod *)0x0;
}

Assistant:

QuantLib::OptimizationMethod* OptimizationFactory::createOptimization(
      const std::string& id, SimInfo*) {
    CreatorMapType::iterator i = creatorMap_.find(id);
    if (i != creatorMap_.end()) {
      // invoke functor to create object
      return (i->second)->create();
    } else {
      return NULL;
    }
  }